

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_save.c
# Opt level: O2

ssize_t mpt_queue_save(mpt_queue *queue,int file)

{
  size_t sVar1;
  iovec io [2];
  
  sVar1 = queue->len;
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    io[0].iov_base = mpt_queue_data(queue,&io[0].iov_len);
    if (io[0].iov_base == (void *)0x0) {
      sVar1 = 0xfffffffffffffff0;
    }
    else {
      io[1].iov_base = queue->base;
      io[1].iov_len = sVar1 - io[0].iov_len;
      sVar1 = writev(file,(iovec *)io,(io[1].iov_len != 0) + 1);
      if (0 < (long)sVar1) {
        mpt_queue_crop(queue,0,sVar1);
      }
    }
  }
  return sVar1;
}

Assistant:

extern ssize_t mpt_queue_save(MPT_STRUCT(queue) *queue, int file)
{
	struct iovec io[2];
	ssize_t len;
	
	if (!(len = queue->len)) {
		return 0;
	}
	/* get used parts */
	if (!(io[0].iov_base = mpt_queue_data(queue, &io[0].iov_len))) {
		return MPT_ERROR(MissingData);
	}
	/* prepare upper data part */
	io[1].iov_base = queue->base;
	io[1].iov_len  = len = len - io[0].iov_len;
	
	/* write queue buffer data to file */
	if ((len = writev(file, io, len ? 2 : 1)) <= 0) {
		return len;
	}
	/* remove written data from queue */
	mpt_queue_crop(queue, 0, len);
	
	return len;
}